

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

bool ON_Locale::ParseName
               (char *locale_name,int locale_name_element_count,char *language_code,
               size_t language_code_capacity,char *extlang_code,size_t extlang_code_capacity,
               char *script_code,size_t script_code_capacity,char *region_code,
               size_t region_code_capacity,char *sortorder,size_t sortorder_capacity)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  char *pcVar9;
  bool local_9b;
  ulong local_98;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  int local_70;
  char c0;
  int pass;
  bool bSortOrderTest;
  bool bRegionTest;
  bool bExtlangTest;
  bool bScriptTest;
  size_t i;
  char *s1;
  char *s0;
  char *locale_name_end;
  size_t sStack_40;
  bool rc;
  size_t extlang_code_capacity_local;
  char *extlang_code_local;
  size_t language_code_capacity_local;
  char *language_code_local;
  char *pcStack_18;
  int locale_name_element_count_local;
  char *locale_name_local;
  
  sStack_40 = extlang_code_capacity;
  extlang_code_capacity_local = (size_t)extlang_code;
  extlang_code_local = (char *)language_code_capacity;
  language_code_capacity_local = (size_t)language_code;
  language_code_local._4_4_ = locale_name_element_count;
  pcStack_18 = locale_name;
  bVar5 = ZeroCharBuffer((char **)&language_code_capacity_local,(size_t *)&extlang_code_local,1);
  bVar6 = ZeroCharBuffer((char **)&extlang_code_capacity_local,&stack0xffffffffffffffc0,1);
  if (!bVar6) {
    bVar5 = false;
  }
  bVar6 = ZeroCharBuffer(&script_code,&script_code_capacity,1);
  if (!bVar6) {
    bVar5 = false;
  }
  bVar6 = ZeroCharBuffer(&region_code,&region_code_capacity,1);
  if (!bVar6) {
    bVar5 = false;
  }
  bVar6 = ZeroCharBuffer(&sortorder,&sortorder_capacity,1);
  if (!bVar6) {
    bVar5 = false;
  }
  if (bVar5) {
    if (((pcStack_18 == (char *)0x0) || (*pcStack_18 == '\0')) || (language_code_local._4_4_ == 0))
    {
      locale_name_local._7_1_ = true;
    }
    else {
      if (language_code_local._4_4_ < 0) {
        language_code_local._4_4_ = ON_String::Length(pcStack_18);
      }
      pcVar4 = pcStack_18;
      if (language_code_local._4_4_ < 2) {
        locale_name_local._7_1_ = false;
      }
      else {
        pcVar9 = pcStack_18 + language_code_local._4_4_;
        s1 = pcStack_18;
        i = (size_t)pcStack_18;
        while (bVar5 = IsAlpha(*(char *)i), bVar5) {
          i = i + 1;
        }
        if ((long)(i - (long)pcVar4) < 2) {
          locale_name_local._7_1_ = false;
        }
        else {
          for (_pass = (char *)0x0; _pass < extlang_code_local && s1 < i; _pass = _pass + 1) {
            cVar8 = ToLower(*s1);
            _pass[language_code_capacity_local] = cVar8;
            s1 = s1 + 1;
          }
          if ((*(char *)language_code_capacity_local == '\0') ||
             (*(char *)(language_code_capacity_local + 1) == '\0')) {
            locale_name_local._7_1_ = false;
          }
          else {
            bVar6 = true;
            bVar5 = true;
            bVar1 = true;
            bVar2 = true;
            for (local_70 = 0; sVar3 = i, local_70 < 4 && i < pcVar9; local_70 = local_70 + 1) {
              cVar8 = *(char *)i;
              if (cVar8 == '\0') {
                return true;
              }
              bVar7 = IsHyphenOrUnderbar(cVar8);
              if (!bVar7) {
                return false;
              }
              s1 = (char *)(i + 1);
              i = (size_t)s1;
              while( true ) {
                local_9b = false;
                if (i < pcVar9) {
                  local_9b = IsAlphaOrDigit(*(char *)i);
                }
                if (local_9b == false) break;
                i = i + 1;
              }
              if ((long)(i - (long)s1) < 2) {
                return false;
              }
              if (bVar5) {
                bVar5 = false;
                bVar7 = IsHyphen(cVar8);
                if (((!bVar7) || (i - (long)s1 != 3)) ||
                   ((bVar7 = IsAlpha(*s1), !bVar7 ||
                    ((bVar7 = IsAlpha(*(char *)(sVar3 + 2)), !bVar7 ||
                     (bVar7 = IsAlpha(*(char *)(sVar3 + 3)), !bVar7)))))) goto LAB_006b1a1f;
                if ((sStack_40 != 0) && (sStack_40 < i - (long)s1)) {
                  return false;
                }
                if (sStack_40 != 0) {
                  for (i_2 = 0; i_2 < sStack_40 && s1 < i; i_2 = i_2 + 1) {
                    cVar8 = ToLower(*s1);
                    *(char *)(extlang_code_capacity_local + i_2) = cVar8;
                    s1 = s1 + 1;
                  }
                }
              }
              else {
LAB_006b1a1f:
                if (bVar6) {
                  bVar6 = false;
                  bVar7 = IsHyphen(cVar8);
                  if (((((bVar7) && (i - (long)s1 == 4)) && (bVar7 = IsAlpha(*s1), bVar7)) &&
                      ((bVar7 = IsAlpha(*(char *)(sVar3 + 2)), bVar7 &&
                       (bVar7 = IsAlpha(*(char *)(sVar3 + 3)), bVar7)))) &&
                     (bVar7 = IsAlpha(*(char *)(sVar3 + 4)), bVar7)) {
                    if ((script_code_capacity != 0) && (script_code_capacity < i - (long)s1)) {
                      return false;
                    }
                    if (script_code_capacity != 0) {
                      cVar8 = ToUpper(*s1);
                      *script_code = cVar8;
                      s1 = (char *)(sVar3 + 2);
                      for (i_3 = 1; i_3 < script_code_capacity && s1 < i; i_3 = i_3 + 1) {
                        cVar8 = ToLower(*s1);
                        script_code[i_3] = cVar8;
                        s1 = s1 + 1;
                      }
                    }
                    goto LAB_006b1dbf;
                  }
                }
                if (bVar1) {
                  bVar1 = false;
                  bVar7 = IsHyphen(cVar8);
                  if (((((bVar7) || (bVar7 = IsUnderbar(cVar8), bVar7)) && (i - (long)s1 == 2)) &&
                      ((bVar7 = IsAlpha(*s1), bVar7 &&
                       (bVar7 = IsAlpha(*(char *)(sVar3 + 2)), bVar7)))) ||
                     (((bVar7 = IsHyphen(cVar8), bVar7 &&
                       ((i - (long)s1 == 3 && (bVar7 = IsDigit(*s1), bVar7)))) &&
                      ((bVar7 = IsDigit(*(char *)(sVar3 + 2)), bVar7 &&
                       (bVar7 = IsDigit(*(char *)(sVar3 + 3)), bVar7)))))) {
                    if ((region_code_capacity != 0) && (region_code_capacity <= i - (long)s1)) {
                      return false;
                    }
                    for (i_4 = 0; i_4 < region_code_capacity && s1 < i; i_4 = i_4 + 1) {
                      cVar8 = ToUpper(*s1);
                      region_code[i_4] = cVar8;
                      s1 = s1 + 1;
                    }
                    goto LAB_006b1dbf;
                  }
                }
                if (!bVar2) {
LAB_006b1d98:
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                             ,0x310,"","Parser needs to be enhanced or input is not valid");
                  return false;
                }
                bVar2 = false;
                bVar7 = IsUnderbar(cVar8);
                if (!bVar7) goto LAB_006b1d98;
                if ((sortorder_capacity != 0) && (sortorder_capacity <= i - (long)s1)) {
                  return false;
                }
                for (local_98 = 0; local_98 < sortorder_capacity && s1 < i; local_98 = local_98 + 1)
                {
                  sortorder[local_98] = *s1;
                  s1 = s1 + 1;
                }
              }
LAB_006b1dbf:
            }
            locale_name_local._7_1_ = true;
          }
        }
      }
    }
  }
  else {
    locale_name_local._7_1_ = false;
  }
  return locale_name_local._7_1_;
}

Assistant:

bool ON_Locale::ParseName(
  const char* locale_name,
  int locale_name_element_count,
  char* language_code,
  size_t language_code_capacity,
  char* extlang_code,
  size_t extlang_code_capacity,
  char* script_code,
  size_t script_code_capacity,
  char* region_code,
  size_t region_code_capacity,
  char* sortorder,
  size_t sortorder_capacity
  )
{
  bool rc = true;

  if ( false == ZeroCharBuffer(language_code, language_code_capacity, sizeof(language_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(extlang_code, extlang_code_capacity, sizeof(extlang_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(script_code,   script_code_capacity,   sizeof(script_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(region_code,   region_code_capacity,   sizeof(region_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(sortorder,     sortorder_capacity,     sizeof(sortorder[0])) )
    rc = false;

  if (!rc)
    return false;

  if ( nullptr == locale_name || 0 == locale_name[0] || 0 == locale_name_element_count )
    return true;

  if ( locale_name_element_count < 0 )
    locale_name_element_count = ON_String::Length(locale_name);

  if ( locale_name_element_count < 2 )
    return false;

  const char* locale_name_end = locale_name + locale_name_element_count;

  const char* s0 = locale_name;
  const char* s1 = s0;
  while( IsAlpha(*s1) )
    s1++;

  if ( s1-s0 < 2 )
    return false;

  for ( size_t i = 0; i < language_code_capacity && s0 < s1 ; i++)
    language_code[i] = ToLower(*s0++); // lower case for language code is a convention

  if ( 0 == language_code[0] || 0 == language_code[1] )
    return false;

  bool bScriptTest = true;
  bool bExtlangTest = true;
  bool bRegionTest = true;
  bool bSortOrderTest = true;

  for (int pass = 0; pass < 4 && s1 < locale_name_end; pass++)
  {
    char c0 = *s1;

    if (0 == c0)
      return true;

    if (false == IsHyphenOrUnderbar(c0))
      return false;

    s1++;
    s0 = s1;
    while (s1 < locale_name_end && IsAlphaOrDigit(*s1))
      s1++;

    if ( s1-s0 < 2 )
      return false;

    if (bExtlangTest)
    {
      bExtlangTest = false;
      if ( IsHyphen(c0)
        && 3 == s1 - s0
        && IsAlpha(s0[0])
        && IsAlpha(s0[1])
        && IsAlpha(s0[2])
        )
      {
        if ( extlang_code_capacity > 0 && extlang_code_capacity < (size_t)(s1-s0) )
          return false;
        if (extlang_code_capacity > 0)
        {
          for (size_t i = 0; i < extlang_code_capacity && s0 < s1; i++)
            extlang_code[i] = ToLower(*s0++); // lower case for extlang code is a convention
        }
        continue;
      }
    }

    if (bScriptTest)
    {
      bScriptTest = false;
      if ( IsHyphen(c0)
        && 4 == s1 - s0
        && IsAlpha(s0[0])
        && IsAlpha(s0[1])
        && IsAlpha(s0[2])
        && IsAlpha(s0[3])
        )
      {
        // ISO 15924 script code
        if ( script_code_capacity > 0 && script_code_capacity < (size_t)(s1-s0) )
          return false;
        if (script_code_capacity > 0)
        {
          // convention is for script codes is CAPITAL, small, small, small case
          script_code[0] = ToUpper(*s0++);
          for (size_t i = 1; i < script_code_capacity && s0 < s1; i++)
            script_code[i] = ToLower(*s0++);
        }
        continue;
      }
    }

    if (bRegionTest)
    {
      bRegionTest = false;
      // IsUnderbar(c0) is here to handle Apple OS X and iOS "locale id" names like "en_US" which use and underbar before region
      if (
        ( (IsHyphen(c0) || IsUnderbar(c0)) && 2 == s1 - s0 && IsAlpha(s0[0]) && IsAlpha(s0[1]) )  // ISO 3166 country/region identifier (2 alpha)
        || ( IsHyphen(c0) && 3 == s1 - s0 && IsDigit(s0[0]) && IsDigit(s0[1]) && IsDigit(s0[2]) ) // UN M.49 code (3 digits)
        )
      {
        if ( region_code_capacity > 0 && region_code_capacity <= (size_t)(s1-s0) )
          return false;
        for (size_t i = 0; i < region_code_capacity && s0 < s1; i++)
          region_code[i] = ToUpper(*s0++); // uppercase for regions is a convention
        continue;
      }
    }

    if (bSortOrderTest)
    {
      bSortOrderTest = false;
      if (IsUnderbar(c0))
      {
        // Windows sort order
        if (sortorder_capacity > 0 && sortorder_capacity <= (size_t)(s1 - s0))
          return false;
        for (size_t i = 0; i < sortorder_capacity && s0 < s1; i++)
          sortorder[i] = *s0++;
        continue;
      }
    }


    ON_ERROR("Parser needs to be enhanced or input is not valid");
    return false;
  }

  return true;

}